

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

void ConvertBGRAToRGBA_SSE2(uint32_t *src,int num_pixels,uint8_t *dst)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong *in_RDX;
  int in_ESI;
  ulong *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i F2;
  __m128i F1;
  __m128i E2;
  __m128i E1;
  __m128i D2;
  __m128i D1;
  __m128i C2;
  __m128i C1;
  __m128i B2;
  __m128i B1;
  __m128i A2;
  __m128i A1;
  __m128i *out;
  __m128i *in;
  __m128i red_blue_mask;
  ulong local_218;
  ulong uStack_210;
  ulong local_208;
  ulong uStack_200;
  ulong *local_178;
  ulong *local_170;
  int local_144;
  
  local_178 = in_RDX;
  local_170 = in_RDI;
  for (local_144 = in_ESI; 7 < local_144; local_144 = local_144 + -8) {
    uVar1 = local_170[1];
    uVar2 = local_170[2];
    uVar3 = local_170[3];
    auVar4._8_8_ = uVar1 & 0xff00ff00ff00ff;
    auVar4._0_8_ = *local_170 & 0xff00ff00ff00ff;
    auVar4 = pshuflw(auVar4,auVar4,0xb1);
    auVar5._8_8_ = uVar3 & 0xff00ff00ff00ff;
    auVar5._0_8_ = uVar2 & 0xff00ff00ff00ff;
    auVar5 = pshuflw(auVar5,auVar5,0xb1);
    auVar4 = pshufhw(auVar4,auVar4,0xb1);
    auVar5 = pshufhw(auVar5,auVar5,0xb1);
    local_208 = auVar4._0_8_;
    uStack_200 = auVar4._8_8_;
    local_218 = auVar5._0_8_;
    uStack_210 = auVar5._8_8_;
    *local_178 = local_208 | *local_170 & 0xff00ff00ff00ff00;
    local_178[1] = uStack_200 | uVar1 & 0xff00ff00ff00ff00;
    local_178[2] = local_218 | uVar2 & 0xff00ff00ff00ff00;
    local_178[3] = uStack_210 | uVar3 & 0xff00ff00ff00ff00;
    local_178 = local_178 + 4;
    local_170 = local_170 + 4;
  }
  if (0 < local_144) {
    VP8LConvertBGRAToRGBA_C((uint32_t *)local_170,local_144,(uint8_t *)local_178);
  }
  return;
}

Assistant:

static void ConvertBGRAToRGBA_SSE2(const uint32_t* WEBP_RESTRICT src,
                                   int num_pixels, uint8_t* WEBP_RESTRICT dst) {
  const __m128i red_blue_mask = _mm_set1_epi32(0x00ff00ff);
  const __m128i* in = (const __m128i*)src;
  __m128i* out = (__m128i*)dst;
  while (num_pixels >= 8) {
    const __m128i A1 = _mm_loadu_si128(in++);
    const __m128i A2 = _mm_loadu_si128(in++);
    const __m128i B1 = _mm_and_si128(A1, red_blue_mask);     // R 0 B 0
    const __m128i B2 = _mm_and_si128(A2, red_blue_mask);     // R 0 B 0
    const __m128i C1 = _mm_andnot_si128(red_blue_mask, A1);  // 0 G 0 A
    const __m128i C2 = _mm_andnot_si128(red_blue_mask, A2);  // 0 G 0 A
    const __m128i D1 = _mm_shufflelo_epi16(B1, _MM_SHUFFLE(2, 3, 0, 1));
    const __m128i D2 = _mm_shufflelo_epi16(B2, _MM_SHUFFLE(2, 3, 0, 1));
    const __m128i E1 = _mm_shufflehi_epi16(D1, _MM_SHUFFLE(2, 3, 0, 1));
    const __m128i E2 = _mm_shufflehi_epi16(D2, _MM_SHUFFLE(2, 3, 0, 1));
    const __m128i F1 = _mm_or_si128(E1, C1);
    const __m128i F2 = _mm_or_si128(E2, C2);
    _mm_storeu_si128(out++, F1);
    _mm_storeu_si128(out++, F2);
    num_pixels -= 8;
  }
  // left-overs
  if (num_pixels > 0) {
    VP8LConvertBGRAToRGBA_C((const uint32_t*)in, num_pixels, (uint8_t*)out);
  }
}